

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locator.cpp
# Opt level: O2

void __thiscall DSDcc::Locator::Locator(Locator *this,string *loc_string)

{
  pointer pcVar1;
  int iVar2;
  string *psVar3;
  long lVar4;
  string asStack_108 [32];
  string local_e8 [32];
  string local_c8 [32];
  string local_a8 [32];
  string local_88 [32];
  string local_68 [32];
  string local_48 [32];
  
  if (loc_string->_M_string_length != 6) {
    psVar3 = (string *)__cxa_allocate_exception(0x20);
    std::__cxx11::string::string(local_48,(string *)loc_string);
    std::__cxx11::string::string(psVar3,local_48);
    __cxa_throw(psVar3,&LocatorInvalidException::typeinfo,
                LocatorInvalidException::~LocatorInvalidException);
  }
  pcVar1 = (loc_string->_M_dataplus)._M_p;
  for (lVar4 = 0; lVar4 != 6; lVar4 = lVar4 + 1) {
    iVar2 = toupper((int)pcVar1[lVar4]);
    pcVar1[lVar4] = (char)iVar2;
  }
  lVar4 = std::__cxx11::string::find(-0x18,(ulong)(uint)(int)*(loc_string->_M_dataplus)._M_p);
  if (lVar4 == -1) {
    psVar3 = (string *)__cxa_allocate_exception(0x20);
    std::__cxx11::string::string(local_68,(string *)loc_string);
    std::__cxx11::string::string(psVar3,local_68);
    __cxa_throw(psVar3,&LocatorInvalidException::typeinfo,
                LocatorInvalidException::~LocatorInvalidException);
  }
  this->m_lon_index1 = (int)lVar4;
  lVar4 = std::__cxx11::string::find('\b',(ulong)(uint)(int)(loc_string->_M_dataplus)._M_p[1]);
  if (lVar4 == -1) {
    psVar3 = (string *)__cxa_allocate_exception(0x20);
    std::__cxx11::string::string(local_88,(string *)loc_string);
    std::__cxx11::string::string(psVar3,local_88);
    __cxa_throw(psVar3,&LocatorInvalidException::typeinfo,
                LocatorInvalidException::~LocatorInvalidException);
  }
  this->m_lat_index1 = (int)lVar4;
  lVar4 = std::__cxx11::string::find('(',(ulong)(uint)(int)(loc_string->_M_dataplus)._M_p[2]);
  if (lVar4 != -1) {
    this->m_lon_index2 = (int)lVar4;
    lVar4 = std::__cxx11::string::find('H',(ulong)(uint)(int)(loc_string->_M_dataplus)._M_p[3]);
    if (lVar4 == -1) {
      psVar3 = (string *)__cxa_allocate_exception(0x20);
      std::__cxx11::string::string(local_c8,(string *)loc_string);
      std::__cxx11::string::string(psVar3,local_c8);
      __cxa_throw(psVar3,&LocatorInvalidException::typeinfo,
                  LocatorInvalidException::~LocatorInvalidException);
    }
    this->m_lat_index2 = (int)lVar4;
    lVar4 = std::__cxx11::string::find('h',(ulong)(uint)(int)(loc_string->_M_dataplus)._M_p[4]);
    if (lVar4 != -1) {
      this->m_lon_index3 = (int)lVar4;
      lVar4 = std::__cxx11::string::find(-0x78,(ulong)(uint)(int)(loc_string->_M_dataplus)._M_p[5]);
      if (lVar4 != -1) {
        this->m_lat_index3 = (int)lVar4;
        this->m_lat = (float)this->m_lat_index2 + (float)this->m_lat_index1 * 10.0 + -90.0 +
                      (float)(int)lVar4 * 0.041666668 + 0.020833334;
        this->m_lon = (float)this->m_lon_index1 * 20.0 + -180.0 +
                      (float)this->m_lon_index2 + (float)this->m_lon_index2 +
                      (float)this->m_lon_index3 * 0.083333336 + 0.041666668;
        return;
      }
      psVar3 = (string *)__cxa_allocate_exception(0x20);
      std::__cxx11::string::string(asStack_108,(string *)loc_string);
      std::__cxx11::string::string(psVar3,asStack_108);
      __cxa_throw(psVar3,&LocatorInvalidException::typeinfo,
                  LocatorInvalidException::~LocatorInvalidException);
    }
    psVar3 = (string *)__cxa_allocate_exception(0x20);
    std::__cxx11::string::string(local_e8,(string *)loc_string);
    std::__cxx11::string::string(psVar3,local_e8);
    __cxa_throw(psVar3,&LocatorInvalidException::typeinfo,
                LocatorInvalidException::~LocatorInvalidException);
  }
  psVar3 = (string *)__cxa_allocate_exception(0x20);
  std::__cxx11::string::string(local_a8,(string *)loc_string);
  std::__cxx11::string::string(psVar3,local_a8);
  __cxa_throw(psVar3,&LocatorInvalidException::typeinfo,
              LocatorInvalidException::~LocatorInvalidException);
}

Assistant:

Locator::Locator(std::string loc_string)
{
  // locator must be exactly 6 characters
  if (loc_string.length() != 6)
    throw LocatorInvalidException(loc_string);
  // convert to upper case
  std::transform(loc_string.begin(), loc_string.end(), loc_string.begin(), toupper);

  // retrieve latitude and longitude indexes

  std::string::size_type sz = m_lon_array1.find(loc_string[0]);

  if (sz == std::string::npos) {
      throw LocatorInvalidException(loc_string);
  } else {
      m_lon_index1 = sz;
  }

  sz = m_lat_array1.find(loc_string[1]);

  if (sz == std::string::npos) {
      throw LocatorInvalidException(loc_string);
  } else {
      m_lat_index1 = sz;
  }

  sz = m_lon_array2.find(loc_string[2]);

  if (sz == std::string::npos) {
      throw LocatorInvalidException(loc_string);
  } else {
      m_lon_index2 = sz;
  }

  sz = m_lat_array2.find(loc_string[3]);

  if (sz == std::string::npos) {
      throw LocatorInvalidException(loc_string);
  } else {
      m_lat_index2 = sz;
  }

  sz = m_lon_array3.find(loc_string[4]);

  if (sz == std::string::npos) {
      throw LocatorInvalidException(loc_string);
  } else {
      m_lon_index3 = sz;
  }

  sz = m_lat_array3.find(loc_string[5]);

  if (sz == std::string::npos) {
      throw LocatorInvalidException(loc_string);
  } else {
      m_lat_index3 = sz;
  }

  // convert to decimal degrees for lower corner of locator square
  m_lat  = (m_lat_index1 * 10.0) - 90.0;
  m_lon  = (m_lon_index1 * 20.0) - 180.0;
  m_lat += m_lat_index2;
  m_lon += m_lon_index2 * 2.0;
  m_lat += m_lat_index3 / 24.0;
  m_lon += m_lon_index3 / 12.0;
  // adjust to center of locator square
  m_lat += 1.25 / 60.0;
  m_lon += 2.5 / 60.0;

}